

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
::_positive_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  ID_index IVar1;
  Dimension DVar2;
  undefined4 uVar3;
  long lVar4;
  _Invoker_type p_Var5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
  *pIVar9;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
  *pIVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  anon_class_1_0_00000001 local_47;
  anon_class_1_0_00000001 local_46;
  anon_class_1_0_00000001 local_45;
  Index local_44;
  anon_class_8_1_e4bd5e45 local_40;
  ulong local_38;
  
  lVar4 = *(long *)&this[1].birthComp_.super__Function_base._M_functor;
  lVar12 = (ulong)columnIndex1 * 0x30;
  lVar13 = (ulong)columnIndex2 * 0x30;
  pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
             *)(lVar4 + lVar13);
  local_44 = columnIndex2;
  if (*(int *)(lVar4 + 8 + lVar12) == -1) {
    local_40.targetColumn._0_4_ = columnIndex1;
    local_38 = CONCAT44(local_38._4_4_,columnIndex2);
    if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001c6e8f:
      local_38 = CONCAT44(local_38._4_4_,columnIndex2);
      local_40.targetColumn._0_4_ = columnIndex1;
      std::__throw_bad_function_call();
    }
    bVar6 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_40,&local_44);
    lVar4 = *(long *)&this[1].birthComp_.super__Function_base._M_functor;
    if ((bVar6) && ((pIVar10->super_Chain_column_option).pairedColumn_ == 0xffffffff)) {
      uVar11 = *(uint *)(lVar4 + 4 + lVar13);
      goto LAB_001c6c9d;
    }
    uVar11 = *(uint *)(lVar4 + 4 + lVar12);
LAB_001c6e0c:
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
               *)(lVar4 + lVar12);
    pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
              *)(lVar13 + lVar4);
    local_40.targetColumn = pIVar10;
    bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    if (bVar6) {
      IVar1 = (pIVar10->super_Chain_column_option).pivot_;
      (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
      (pIVar9->super_Chain_column_option).pivot_ = IVar1;
      DVar2 = (pIVar10->super_Column_dimension_option).dim_;
      (pIVar10->super_Column_dimension_option).dim_ = (pIVar9->super_Column_dimension_option).dim_;
      (pIVar9->super_Column_dimension_option).dim_ = DVar2;
    }
    uVar7 = (pIVar10->super_Chain_column_option).pivot_;
    columnIndex1 = (Index)local_38;
  }
  else {
    pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
              *)(lVar4 + lVar12);
    if ((pIVar10->super_Chain_column_option).pairedColumn_ == 0xffffffff) {
      uVar11 = (pIVar10->super_Chain_column_option).pivot_;
      local_40.targetColumn = pIVar10;
      bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar6) {
        IVar1 = (pIVar10->super_Chain_column_option).pivot_;
        (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
        (pIVar9->super_Chain_column_option).pivot_ = IVar1;
        DVar2 = (pIVar10->super_Column_dimension_option).dim_;
        (pIVar10->super_Column_dimension_option).dim_ = (pIVar9->super_Column_dimension_option).dim_
        ;
        (pIVar9->super_Column_dimension_option).dim_ = DVar2;
      }
      uVar7 = (pIVar10->super_Chain_column_option).pivot_;
      if (uVar11 == uVar7) {
        return columnIndex1;
      }
      goto LAB_001c6e69;
    }
    local_40.targetColumn._0_4_ = columnIndex1;
    local_38 = CONCAT44(local_38._4_4_,columnIndex2);
    if ((this->deathComp_).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001c6e8f;
    bVar6 = (*(this->deathComp_)._M_invoker)
                      ((_Any_data *)&this->deathComp_,(uint *)&local_40,&local_44);
    lVar4 = *(long *)&this[1].birthComp_.super__Function_base._M_functor;
    if (!bVar6) {
      lVar8 = (ulong)(pIVar9->super_Chain_column_option).pairedColumn_ * 0x30;
      pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
                *)(lVar4 + lVar8);
      uVar11 = *(uint *)(lVar4 + 4 + lVar8);
      pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
                 *)((ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x30 + lVar4);
      local_40.targetColumn = pIVar9;
      bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar10,pIVar9,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar6) {
        IVar1 = (pIVar9->super_Chain_column_option).pivot_;
        (pIVar9->super_Chain_column_option).pivot_ = (pIVar10->super_Chain_column_option).pivot_;
        (pIVar10->super_Chain_column_option).pivot_ = IVar1;
        DVar2 = (pIVar9->super_Column_dimension_option).dim_;
        (pIVar9->super_Column_dimension_option).dim_ = (pIVar10->super_Column_dimension_option).dim_
        ;
        (pIVar10->super_Column_dimension_option).dim_ = DVar2;
      }
      uVar7 = (pIVar9->super_Chain_column_option).pivot_;
      if (uVar11 != uVar7) {
        p_Var5 = this[1].birthComp_._M_invoker;
        uVar3 = *(undefined4 *)(p_Var5 + (ulong)uVar11 * 4);
        *(undefined4 *)(p_Var5 + (ulong)uVar11 * 4) = *(undefined4 *)(p_Var5 + (ulong)uVar7 * 4);
        *(undefined4 *)(p_Var5 + (ulong)uVar7 * 4) = uVar3;
      }
      lVar4 = *(long *)&this[1].birthComp_.super__Function_base._M_functor;
      uVar11 = *(uint *)(lVar4 + 4 + lVar12);
      goto LAB_001c6e0c;
    }
    lVar8 = (ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x30;
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
               *)(lVar4 + lVar8);
    local_38 = (ulong)*(uint *)(lVar4 + 4 + lVar8);
    pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
              *)((ulong)(pIVar9->super_Chain_column_option).pairedColumn_ * 0x30 + lVar4);
    local_40.targetColumn = pIVar10;
    bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    if (bVar6) {
      IVar1 = (pIVar10->super_Chain_column_option).pivot_;
      (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
      (pIVar9->super_Chain_column_option).pivot_ = IVar1;
      DVar2 = (pIVar10->super_Column_dimension_option).dim_;
      (pIVar10->super_Column_dimension_option).dim_ = (pIVar9->super_Column_dimension_option).dim_;
      (pIVar9->super_Column_dimension_option).dim_ = DVar2;
    }
    uVar11 = (pIVar10->super_Chain_column_option).pivot_;
    if ((uint)local_38 != uVar11) {
      p_Var5 = this[1].birthComp_._M_invoker;
      uVar3 = *(undefined4 *)(p_Var5 + local_38 * 4);
      *(undefined4 *)(p_Var5 + local_38 * 4) = *(undefined4 *)(p_Var5 + (ulong)uVar11 * 4);
      *(undefined4 *)(p_Var5 + (ulong)uVar11 * 4) = uVar3;
    }
    lVar4 = *(long *)&this[1].birthComp_.super__Function_base._M_functor;
    uVar11 = *(uint *)(lVar4 + 4 + lVar13);
LAB_001c6c9d:
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
               *)(lVar4 + lVar13);
    pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
              *)(lVar12 + lVar4);
    local_40.targetColumn = pIVar10;
    bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    if (bVar6) {
      IVar1 = (pIVar10->super_Chain_column_option).pivot_;
      (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
      (pIVar9->super_Chain_column_option).pivot_ = IVar1;
      DVar2 = (pIVar10->super_Column_dimension_option).dim_;
      (pIVar10->super_Column_dimension_option).dim_ = (pIVar9->super_Column_dimension_option).dim_;
      (pIVar9->super_Column_dimension_option).dim_ = DVar2;
    }
    uVar7 = (pIVar10->super_Chain_column_option).pivot_;
  }
  if (uVar11 == uVar7) {
    return columnIndex1;
  }
LAB_001c6e69:
  p_Var5 = this[1].birthComp_._M_invoker;
  uVar3 = *(undefined4 *)(p_Var5 + (ulong)uVar11 * 4);
  *(undefined4 *)(p_Var5 + (ulong)uVar11 * 4) = *(undefined4 *)(p_Var5 + (ulong)uVar7 * 4);
  *(undefined4 *)(p_Var5 + (ulong)uVar7 * 4) = uVar3;
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }
  // TODO: factorize the cases
  // But for debug it is much more easier to understand what is happening when split like this
  if (!col1.is_paired()) {  // F x *
    bool hasSmallerBirth;
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      // this order because position were swapped with CP::swap_positions
      hasSmallerBirth = (CP::birth(col2.get_pivot()) < CP::birth(col1.get_pivot()));
    } else {
      hasSmallerBirth = birthComp_(columnIndex1, columnIndex2);
    }

    if (!col2.is_paired() && hasSmallerBirth) {
      _matrix()->add_to(columnIndex1, columnIndex2);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
      }
      return columnIndex1;
    }
    _matrix()->add_to(columnIndex2, columnIndex1);

    return columnIndex2;
  }

  if (!col2.is_paired()) {  // G x F
    static_cast<Master_chain_matrix*>(this)->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  bool hasSmallerDeath;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    // this order because position were swapped with CP::swap_positions
    hasSmallerDeath = (CP::death(col2.get_pivot()) < CP::death(col1.get_pivot()));
  } else {
    hasSmallerDeath = deathComp_(columnIndex1, columnIndex2);
  }

  // G x G
  if (hasSmallerDeath)
  {
    _matrix()->add_to(col1.get_paired_chain_index(), col2.get_paired_chain_index());
    _matrix()->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  _matrix()->add_to(col2.get_paired_chain_index(), col1.get_paired_chain_index());
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}